

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O0

Am_Wrapper * __thiscall Am_String_Data::Make_Unique(Am_String_Data *this)

{
  bool bVar1;
  Am_String_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Am_String_Data *)operator_new(0x18);
    Am_String_Data(this_local,this->value,true);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

bool
Am_String_Data::operator==(const Am_String_Data &test_value) const
{
  return (this == &test_value) || !strcmp((const char *)test_value, value);
}